

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O0

void Hacl_Hash_Blake2s_Simd128_finish
               (uint32_t nn,uint8_t *output,Lib_IntVector_Intrinsics_vec128 *hash)

{
  uint8_t *final;
  Lib_IntVector_Intrinsics_vec128 *row1;
  Lib_IntVector_Intrinsics_vec128 *row0;
  uint8_t *second;
  uint8_t *first;
  uint8_t b [32];
  Lib_IntVector_Intrinsics_vec128 *hash_local;
  uint8_t *output_local;
  uint32_t nn_local;
  
  memset(&first,0,0x20);
  first = (uint8_t *)(*hash)[0];
  b._0_8_ = (*hash)[1];
  b._8_8_ = hash[1][0];
  b._16_8_ = hash[1][1];
  memcpy(output,&first,(ulong)nn);
  Lib_Memzero0_memzero0(&first,0x20);
  return;
}

Assistant:

void
Hacl_Hash_Blake2s_Simd128_finish(
  uint32_t nn,
  uint8_t *output,
  Lib_IntVector_Intrinsics_vec128 *hash
)
{
  uint8_t b[32U] = { 0U };
  uint8_t *first = b;
  uint8_t *second = b + 16U;
  Lib_IntVector_Intrinsics_vec128 *row0 = hash;
  Lib_IntVector_Intrinsics_vec128 *row1 = hash + 1U;
  Lib_IntVector_Intrinsics_vec128_store32_le(first, row0[0U]);
  Lib_IntVector_Intrinsics_vec128_store32_le(second, row1[0U]);
  uint8_t *final = b;
  memcpy(output, final, nn * sizeof (uint8_t));
  Lib_Memzero0_memzero(b, 32U, uint8_t, void *);
}